

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O1

void __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL>,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
::tuple_base(tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL>,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
             *this,tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL>,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
                   *param_1)

{
  unsigned_long uVar1;
  
  uVar1 = (param_1->
          super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_false>
          ).value.m_view.second;
  (this->
  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_false>).
  value.m_view.first =
       (param_1->
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_false>)
       .value.m_view.first;
  (this->
  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<42U,_Fixpp::Type::UTCTimestamp>_>,_false>).
  value.m_view.second = uVar1;
  uVar1 = (param_1->
          super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_false>).
          value.m_view.second;
  (this->super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_false>).value
  .m_view.first =
       (param_1->
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_false>).value.
       m_view.first;
  (this->super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<61U,_Fixpp::Type::Char>_>,_false>).value
  .m_view.second = uVar1;
  uVar1 = (param_1->
          super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_false>).
          value.m_view.second;
  (this->super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_false>).
  value.m_view.first =
       (param_1->
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_false>).
       value.m_view.first;
  (this->super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<148U,_Fixpp::Type::String>_>,_false>).
  value.m_view.second = uVar1;
  uVar1 = (param_1->
          super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_false>).
          value.m_view.second;
  (this->super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_false>).value
  .m_view.first =
       (param_1->
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_false>).value.
       m_view.first;
  (this->super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<358U,_Fixpp::Type::Int>_>,_false>).value
  .m_view.second = uVar1;
  uVar1 = (param_1->
          super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_false>).
          value.m_view.second;
  (this->super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_false>).
  value.m_view.first =
       (param_1->
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_false>).value.
       m_view.first;
  (this->super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<359U,_Fixpp::Type::Data>_>,_false>).
  value.m_view.second = uVar1;
  llvm::
  SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_10U>
  ::SmallVector((SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_10U>
                 *)&this->
                    super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
                ,(SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_10U>
                  *)&param_1->
                     super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>_>,_false>
               );
  llvm::
  SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_10U>
  ::SmallVector((SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_10U>
                 *)&this->
                    super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_false>
                ,(SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_10U>
                  *)&param_1->
                     super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>,_false>
               );
  llvm::
  SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_10U>
  ::SmallVector((SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_10U>
                 *)&this->
                    super_tuple_value<7UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                ,(SmallVector<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_10U>
                  *)&param_1->
                     super_tuple_value<7UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
               );
  uVar1 = (param_1->
          super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_false>).
          value.m_view.second;
  (this->super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_false>).
  value.m_view.first =
       (param_1->
       super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_false>).
       value.m_view.first;
  (this->super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<149U,_Fixpp::Type::String>_>,_false>).
  value.m_view.second = uVar1;
  uVar1 = (param_1->
          super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>).value
          .m_view.second;
  (this->super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>).value.
  m_view.first = (param_1->
                 super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>
                 ).value.m_view.first;
  (this->super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>).value.
  m_view.second = uVar1;
  uVar1 = (param_1->
          super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>).
          value.m_view.second;
  (this->super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>).
  value.m_view.first =
       (param_1->
       super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>).value.
       m_view.first;
  (this->super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>).
  value.m_view.second = uVar1;
  return;
}

Assistant:

tuple_base& operator=( const tuple_base& v )
        noexcept( seq::is_all< std::is_nothrow_copy_assignable< Ts >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( static_cast< tuple_value< Is, Ts >& >( v ).get() ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( static_cast< tuple_value< Is, Ts >& >( v ).get() ), true )..., true };
#endif
        return *this;
      }